

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractprintdialog.cpp
# Opt level: O0

void __thiscall QPrintDialog::done(QPrintDialog *this,int result)

{
  bool bVar1;
  QObject *this_00;
  char *pcVar2;
  int in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c_for_o *unaff_retaddr;
  ContextType *in_stack_00000008;
  Object *in_stack_00000010;
  QAbstractPrintDialogPrivate *d;
  undefined4 in_stack_00000030;
  ConnectionType in_stack_00000050;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Connection local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_>::data
            ((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)(in_RDI + 8));
  if (in_ESI == 1) {
    in_stack_ffffffffffffffa8 = 0x100;
    QObject::connect<void(QDialog::*)(),QPrintDialog::done(int)::__0>
              (in_stack_00000010,CONCAT44(result,in_stack_00000030),in_stack_00000008,unaff_retaddr,
               in_stack_00000050);
    QMetaObject::Connection::~Connection(local_10);
  }
  QDialog::done((int)in_RDI);
  bVar1 = QPointer::operator_cast_to_bool((QPointer<QObject> *)0x15fa39);
  if (bVar1) {
    this_00 = QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x15fa50);
    pcVar2 = QByteArray::operator_cast_to_char_((QByteArray *)0x15fa66);
    QObject::disconnect(in_RDI,"2accepted(QPrinter*)",this_00,pcVar2);
    QPointer<QObject>::operator=
              ((QPointer<QObject> *)this_00,
               (QObject *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  QByteArray::clear();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPrintDialog::done(int result)
{
    auto *d = static_cast<QAbstractPrintDialogPrivate *>(d_ptr.data());
    if (result == Accepted) {
        // Emit accepted(QPrinter*) at the same time as the dialog
        // is accepted. Doing it here is too late, as done() will
        // also emit finished().
        QObject::connect(this, &QDialog::accepted, this, [this]{
            emit accepted(printer());
        }, Qt::SingleShotConnection);
    }
    QDialog::done(result);
    if (d->receiverToDisconnectOnClose) {
        disconnect(this, SIGNAL(accepted(QPrinter*)),
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
}